

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.c
# Opt level: O1

int wally_addr_segwit_from_bytes
              (uchar *bytes,size_t bytes_len,char *addr_family,uint32_t flags,char **output)

{
  uchar uVar1;
  int iVar2;
  uint32_t uVar3;
  size_t sVar4;
  char *pcVar5;
  uint uVar6;
  byte bVar7;
  int iVar8;
  long lVar9;
  byte *pbVar10;
  byte bVar11;
  byte *pbVar12;
  size_t sVar13;
  size_t push_size;
  uint8_t data [65];
  char result [90];
  size_t local_f8;
  size_t local_f0;
  byte local_e8 [80];
  byte local_98 [104];
  
  if (output != (char **)0x0) {
    *output = (char *)0x0;
  }
  iVar8 = -2;
  if ((((output != (char **)0x0) && (bytes_len != 0)) && (bytes != (uchar *)0x0)) &&
     ((addr_family != (char *)0x0 && (flags == 0)))) {
    uVar1 = *bytes;
    if (uVar1 == '\0') {
      bVar11 = 0;
    }
    else {
      if (0xf < (byte)(uVar1 + 0xaf)) {
        return -2;
      }
      bVar11 = uVar1 + 0xb0;
    }
    iVar2 = script_get_push_size_from_bytes(bytes + 1,bytes_len - 1,&local_f8);
    if ((iVar2 == 0) && (((bVar11 != 0 || (local_f8 == 0x20)) || (local_f8 == 0x14)))) {
      local_98[0] = 0;
      sVar13 = bytes_len - 2;
      local_f0 = 0;
      if ((bytes_len - 0x2b < 0xffffffffffffffd9) ||
         ((sVar13 != 0x14 && sVar13 != 0x20) && bVar11 == 0)) {
        wally_clear_2(local_e8,0x41,bytes + 2,sVar13);
      }
      else {
        local_e8[0] = bVar11;
        convert_bits((uint8_t *)((long)local_e8 + 1),&local_f0,5,bytes + 2,sVar13,8,1);
        sVar13 = local_f0;
        sVar4 = local_f0 + 1;
        uVar3 = 1;
        local_f0 = sVar4;
        for (lVar9 = 0; bVar7 = addr_family[lVar9], bVar7 != 0; lVar9 = lVar9 + 1) {
          if (0xe5 < (byte)(bVar7 + 0xa5) || 0x5d < (byte)(bVar7 - 0x21)) goto LAB_004afce5;
          uVar3 = bech32_polymod_step(uVar3);
          uVar3 = bVar7 >> 5 ^ uVar3;
        }
        if (sVar13 + lVar9 + 8 < 0x5b) {
          uVar3 = bech32_polymod_step(uVar3);
          bVar7 = *addr_family;
          if (bVar7 == 0) {
            pbVar10 = local_98;
          }
          else {
            pbVar12 = (byte *)(addr_family + 1);
            pbVar10 = local_98;
            do {
              uVar3 = bech32_polymod_step(uVar3);
              *pbVar10 = bVar7;
              uVar3 = bVar7 & 0x1f ^ uVar3;
              pbVar10 = pbVar10 + 1;
              bVar7 = *pbVar12;
              pbVar12 = pbVar12 + 1;
            } while (bVar7 != 0);
          }
          *pbVar10 = 0x31;
          pbVar10 = pbVar10 + 1;
          if (sVar4 != 0) {
            sVar13 = 0;
            do {
              bVar7 = local_e8[sVar13];
              if (0x1f < bVar7) goto LAB_004afce5;
              uVar3 = bech32_polymod_step(uVar3);
              uVar3 = uVar3 ^ bVar7;
              pbVar10[sVar13] = "qpzry9x8gf2tvdw0s3jn54khce6mua7l"[bVar7];
              sVar13 = sVar13 + 1;
            } while (sVar4 != sVar13);
            pbVar10 = pbVar10 + sVar13;
          }
          lVar9 = 6;
          do {
            uVar3 = bech32_polymod_step(uVar3);
            lVar9 = lVar9 + -1;
          } while (lVar9 != 0);
          uVar6 = 0x2bc830a3;
          if (bVar11 == 0) {
            uVar6 = 1;
          }
          bVar11 = 0x19;
          lVar9 = 0;
          do {
            pbVar10[lVar9] =
                 "qpzry9x8gf2tvdw0s3jn54khce6mua7l"[(uVar3 ^ uVar6) >> (bVar11 & 0x1f) & 0x1f];
            lVar9 = lVar9 + 1;
            bVar11 = bVar11 - 5;
          } while (lVar9 != 6);
          pbVar10[6] = 0;
          pcVar5 = wally_strdup((char *)local_98);
          *output = pcVar5;
          wally_clear(local_98,0x5a);
          return (uint)(*output != (char *)0x0) * 3 + -3;
        }
      }
LAB_004afce5:
      iVar8 = -1;
    }
  }
  return iVar8;
}

Assistant:

int wally_addr_segwit_from_bytes(const unsigned char *bytes, size_t bytes_len,
                                 const char *addr_family, uint32_t flags,
                                 char **output)
{
    char result[90];
    size_t push_size;
    int ret;
    uint8_t witness_version;

    if (output)
        *output = 0;

    if (!addr_family || flags || !bytes || !bytes_len || !output)
        return WALLY_EINVAL;

    if (bytes[0] == 0)
        witness_version = 0;
    else if (bytes[0] >= OP_1 && bytes[0] <= OP_16)
        witness_version = bytes[0] - (OP_1 - 1);
    else
        return WALLY_EINVAL;

    ret = script_get_push_size_from_bytes(bytes + 1, bytes_len - 1, &push_size);
    if (ret != WALLY_OK)
        return WALLY_EINVAL;
    else if (witness_version == 0 && push_size != HASH160_LEN && push_size != SHA256_LEN)
        return WALLY_EINVAL;

    result[0] = '\0';
    if (!segwit_addr_encode(result, addr_family, witness_version, bytes + 2, bytes_len - 2))
        return WALLY_ERROR;

    *output = wally_strdup(result);
    wally_clear(result, sizeof(result));
    return *output ? WALLY_OK : WALLY_ENOMEM;
}